

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_dec.c
# Opt level: O3

uint8_t * WebPDecodeYUVInto(uint8_t *data,size_t data_size,uint8_t *luma,size_t luma_size,
                           int luma_stride,uint8_t *u,size_t u_size,int u_stride,uint8_t *v,
                           size_t v_size,int v_stride)

{
  int iVar1;
  VP8StatusCode VVar2;
  uint8_t *puVar3;
  WebPDecBuffer local_118;
  WebPDecParams local_a0;
  
  if ((luma == (uint8_t *)0x0) || (iVar1 = WebPInitDecBufferInternal(&local_118,0x209), iVar1 == 0))
  {
    puVar3 = (uint8_t *)0x0;
  }
  else {
    local_a0.emit = (OutputFunc)0x0;
    local_a0.emit_alpha = (OutputAlphaFunc)0x0;
    local_a0.scaler_a = (WebPRescaler *)0x0;
    local_a0.memory = (void *)0x0;
    local_a0.scaler_u = (WebPRescaler *)0x0;
    local_a0.scaler_v = (WebPRescaler *)0x0;
    local_a0.options = (WebPDecoderOptions *)0x0;
    local_a0.scaler_y = (WebPRescaler *)0x0;
    local_a0.tmp_v = (uint8_t *)0x0;
    local_a0.last_y = 0;
    local_a0._36_4_ = 0;
    local_a0.tmp_y = (uint8_t *)0x0;
    local_a0.tmp_u = (uint8_t *)0x0;
    local_a0.emit_alpha_row = (OutputRowFunc)0x0;
    local_118.colorspace = MODE_YUV;
    local_118.u.YUVA.u_stride = u_stride;
    local_118.u.YUVA.u_size = u_size;
    local_118.u.YUVA.v = v;
    local_118.u.YUVA.v_stride = v_stride;
    local_118.u.YUVA.v_size = v_size;
    local_118.is_external_memory = 1;
    local_118.u.RGBA.rgba = luma;
    local_118.u.YUVA.u = u;
    local_118.u.YUVA.y_stride = luma_stride;
    local_118.u.YUVA.y_size = luma_size;
    local_a0.output = &local_118;
    VVar2 = DecodeInto(data,data_size,&local_a0);
    puVar3 = (uint8_t *)0x0;
    if (VVar2 == VP8_STATUS_OK) {
      puVar3 = luma;
    }
  }
  return puVar3;
}

Assistant:

uint8_t* WebPDecodeYUVInto(const uint8_t* data, size_t data_size,
                           uint8_t* luma, size_t luma_size, int luma_stride,
                           uint8_t* u, size_t u_size, int u_stride,
                           uint8_t* v, size_t v_size, int v_stride) {
  WebPDecParams params;
  WebPDecBuffer output;
  if (luma == NULL || !WebPInitDecBuffer(&output)) return NULL;
  WebPResetDecParams(&params);
  params.output = &output;
  output.colorspace      = MODE_YUV;
  output.u.YUVA.y        = luma;
  output.u.YUVA.y_stride = luma_stride;
  output.u.YUVA.y_size   = luma_size;
  output.u.YUVA.u        = u;
  output.u.YUVA.u_stride = u_stride;
  output.u.YUVA.u_size   = u_size;
  output.u.YUVA.v        = v;
  output.u.YUVA.v_stride = v_stride;
  output.u.YUVA.v_size   = v_size;
  output.is_external_memory = 1;
  if (DecodeInto(data, data_size, &params) != VP8_STATUS_OK) {
    return NULL;
  }
  return luma;
}